

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

LO Omega_h::find_last<int>(Read<int> *array,int value)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  type_conflict transform;
  Alloc *local_28;
  
  local_28 = (array->write_).shared_alloc_.alloc;
  if (((ulong)local_28 & 1) == 0) {
    uVar3 = local_28->size;
  }
  else {
    uVar3 = (ulong)local_28 >> 3;
  }
  if (((ulong)local_28 & 7) == 0 && local_28 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_28 = (Alloc *)(local_28->size * 8 + 1);
    }
    else {
      local_28->use_count = local_28->use_count + 1;
    }
  }
  iVar2 = transform_reduce<Omega_h::IntIterator,Omega_h::find_last<int>(Omega_h::Read<int>,int)::_lambda(int)_1_,int,Omega_h::maximum<int>>
                    (0,uVar3 >> 2 & 0xffffffff,0xffffffff);
  if (((ulong)local_28 & 7) == 0 && local_28 != (Alloc *)0x0) {
    piVar1 = &local_28->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_28);
      operator_delete(local_28,0x48);
    }
  }
  return iVar2;
}

Assistant:

Write<T> divide_each(Read<T> a, Read<T> b, std::string const& name) {
  auto width = divide_no_remainder(a.size(), b.size());
  Write<T> c(a.size(), name);
  auto f = OMEGA_H_LAMBDA(LO i) {
    for (Int j = 0; j < width; ++j) {
      c[i * width + j] = a[i * width + j] / b[i];
    }
  };
  parallel_for(b.size(), f, "divide_each");
  return c;
}